

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::ParseNode_Metadata
          (X3DImporter *this,CX3DImporter_NodeElement *pParentElement,string *param_2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool close_found;
  string *param_2_local;
  CX3DImporter_NodeElement *pParentElement_local;
  X3DImporter *this_local;
  
  psStack_20 = param_2;
  param_2_local = (string *)pParentElement;
  pParentElement_local = (CX3DImporter_NodeElement *)this;
  ParseHelper_Node_Enter(this,pParentElement);
  local_21 = 0;
  do {
    do {
      while( true ) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        uVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) goto LAB_00aa2552;
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
        if (!bVar1) {
          pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])
                            ();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,(char *)CONCAT44(extraout_var,iVar3),&local_49);
          XML_CheckNode_SkipUnsupported(this,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::allocator<char>::~allocator(&local_49);
        }
      }
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,(char *)CONCAT44(extraout_var_00,iVar3),&local_81);
    bVar1 = XML_CheckNode_NameEqual(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  } while (!bVar1);
  local_21 = 1;
LAB_00aa2552:
  if ((local_21 & 1) == 0) {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,(char *)CONCAT44(extraout_var_01,iVar3),&local_a9);
    Throw_CloseNotFound(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  ParseHelper_Node_Exit(this);
  return;
}

Assistant:

void X3DImporter::ParseNode_Metadata(CX3DImporter_NodeElement* pParentElement, const std::string& /*pNodeName*/)
{
	ParseHelper_Node_Enter(pParentElement);
	MACRO_NODECHECK_METADATA(mReader->getNodeName());
	ParseHelper_Node_Exit();
}